

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O3

int cdns_init_server(event_base *base)

{
  sa_family_t sVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  sockaddr_storage addr;
  
  iVar3 = 10;
  iVar2 = evutil_inet_pton(10,g_cdns_cfg.local_ip,addr.__ss_padding + 6);
  sVar1 = 10;
  if (iVar2 != 1) {
    iVar3 = 2;
    iVar2 = evutil_inet_pton(2,g_cdns_cfg.local_ip,addr.__ss_padding + 2);
    sVar1 = 2;
    if (iVar2 != 1) {
      pcVar4 = "evutil_inet_pton";
      iVar2 = 0x37c;
      goto LAB_00106260;
    }
  }
  addr.ss_family = sVar1;
  addr.__ss_padding._0_2_ = g_cdns_cfg.local_port << 8 | g_cdns_cfg.local_port >> 8;
  iVar2 = socket(iVar3,2,0x11);
  if (iVar2 != -1) {
    iVar3 = bind(iVar2,(sockaddr *)&addr,0x80);
    if (iVar3 == 0) {
      iVar3 = evutil_make_socket_nonblocking(iVar2);
      if (iVar3 == 0) {
        listener = (event *)event_new(base,iVar2,0x12,cdns_pkt_from_client,base);
        if (listener == (event *)0x0) {
          pcVar4 = "event_new";
          iVar3 = 0x394;
        }
        else {
          iVar3 = event_add(listener,0);
          if (iVar3 == 0) {
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c"
                       ,0x39e,"cdns_init_server",0,6,"cdns @ %s:%u",g_cdns_cfg.local_ip,
                       (ulong)g_cdns_cfg.local_port);
            start_tester(base);
            return 0;
          }
          pcVar4 = "event_add";
          iVar3 = 0x39a;
        }
      }
      else {
        pcVar4 = "evutil_make_socket_nonblocking";
        iVar3 = 0x38e;
      }
    }
    else {
      pcVar4 = "bind";
      iVar3 = 0x388;
    }
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",iVar3,
               "cdns_init_server",1,3,pcVar4);
    cdns_fini_server();
    iVar2 = evutil_closesocket(iVar2);
    if (iVar2 == 0) {
      return -1;
    }
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3a8,
               "cdns_init_server",1,4,"evutil_closesocket");
    return -1;
  }
  pcVar4 = "socket";
  iVar2 = 0x382;
LAB_00106260:
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",iVar2,
             "cdns_init_server",1,3,pcVar4);
  cdns_fini_server();
  return -1;
}

Assistant:

int cdns_init_server(struct event_base * base)
{
    int error;
    int fd = -1;
    struct sockaddr_storage addr;
    struct sockaddr_in * addr4 = (struct sockaddr_in *)&addr;
    struct sockaddr_in6 * addr6 = (struct sockaddr_in6 *)&addr;

    if (evutil_inet_pton(AF_INET6, g_cdns_cfg.local_ip, &addr6->sin6_addr) == 1) {
        addr6->sin6_family = AF_INET6;
        addr6->sin6_port = htons(g_cdns_cfg.local_port);
    }
    else if (evutil_inet_pton(AF_INET, g_cdns_cfg.local_ip, &addr4->sin_addr) == 1) {
        addr4->sin_family = AF_INET;
        addr4->sin_port = htons(g_cdns_cfg.local_port);
    }
    else {
        log_errno(LOG_ERR, "evutil_inet_pton");
        goto fail;
    }

    fd = socket(addr.ss_family, SOCK_DGRAM, IPPROTO_UDP);
    if (fd == -1) {
        log_errno(LOG_ERR, "socket");
        goto fail;
    }

    error = bind(fd, (struct sockaddr*)&addr, sizeof(addr));
    if (error) {
        log_errno(LOG_ERR, "bind");
        goto fail;
    }

    error = evutil_make_socket_nonblocking(fd);
    if (error) {
        log_errno(LOG_ERR, "evutil_make_socket_nonblocking");
        goto fail;
    }

    listener = event_new(base, fd, EV_READ | EV_PERSIST, cdns_pkt_from_client, base);
    if (!listener) {
        log_errno(LOG_ERR, "event_new");
        goto fail;
    }
    error = event_add(listener, NULL);
    if (error)
    {
        log_errno(LOG_ERR, "event_add");
        goto fail;
    }

    log_error(LOG_INFO, "cdns @ %s:%u", g_cdns_cfg.local_ip, g_cdns_cfg.local_port);

    // Start tester to collect information for each server
    start_tester(base);
    return 0;

fail:
    cdns_fini_server();

    if (fd != -1 && evutil_closesocket(fd) != 0)
        log_errno(LOG_WARNING, "evutil_closesocket");

    return -1;
}